

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_error qpdf_get_error(qpdf_data qpdf)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _qpdf_error *p_Var2;
  
  peVar1 = (qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    p_Var2 = (_qpdf_error *)0x0;
  }
  else {
    p_Var2 = &qpdf->tmp_error;
    (qpdf->tmp_error).exc.super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(qpdf->tmp_error).exc.super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this = (qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  return p_Var2;
}

Assistant:

qpdf_error
qpdf_get_error(qpdf_data qpdf)
{
    if (qpdf->error.get()) {
        qpdf->tmp_error.exc = qpdf->error;
        qpdf->error = nullptr;
        QTC::TC("qpdf", "qpdf-c qpdf_get_error returned error");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}